

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

int llvm::APInt::tcMultiply(WordType *dst,WordType *lhs,WordType *rhs,uint parts)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  if ((dst != lhs) && (dst != rhs)) {
    uVar3 = 0;
    tcSet(dst,0,parts);
    uVar2 = (ulong)parts;
    while (uVar2 != 0) {
      uVar1 = tcMultiplyPart(dst,lhs,*rhs,0,parts,(uint)uVar2,true);
      uVar3 = uVar3 | uVar1;
      dst = dst + 1;
      rhs = rhs + 1;
      uVar2 = uVar2 - 1;
    }
    return uVar3;
  }
  __assert_fail("dst != lhs && dst != rhs",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x9ad,
                "static int llvm::APInt::tcMultiply(WordType *, const WordType *, const WordType *, unsigned int)"
               );
}

Assistant:

int APInt::tcMultiply(WordType *dst, const WordType *lhs,
                      const WordType *rhs, unsigned parts) {
  assert(dst != lhs && dst != rhs);

  int overflow = 0;
  tcSet(dst, 0, parts);

  for (unsigned i = 0; i < parts; i++)
    overflow |= tcMultiplyPart(&dst[i], lhs, rhs[i], 0, parts,
                               parts - i, true);

  return overflow;
}